

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O0

void wasm::printElement(ostream *os,Element *elem,int depth)

{
  bool bVar1;
  ElementImpl *pEVar2;
  add_pointer_t<const_wasm::RandomElement<wasm::RandomFullLattice>_> elem_00;
  add_pointer_t<const_wasm::analysis::Flat<unsigned_int>::Element> this;
  ostream *poVar3;
  uint *puVar4;
  optional<wasm::RandomElement<wasm::RandomLattice>_> *this_00;
  RandomElement<wasm::RandomLattice> *elem_01;
  add_pointer_t<const_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>_> this_01;
  const_reference pvVar5;
  add_pointer_t<const_std::vector<wasm::RandomElement<wasm::RandomLattice>_>_> this_02;
  reference elem_02;
  add_pointer_t<const_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>_>
  __t;
  __tuple_element_t<0UL,_tuple<RandomElement<RandomLattice>,_RandomElement<RandomLattice>_>_>
  *elem_03;
  __tuple_element_t<1UL,_tuple<RandomElement<RandomLattice>,_RandomElement<RandomLattice>_>_>
  *elem_04;
  add_pointer_t<const_wasm::analysis::SharedPath<wasm::RandomLattice>::Element> this_03;
  Element *elem_05;
  Element *e_6;
  type *second;
  type *first;
  tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_> *e_5;
  RandomElement<wasm::RandomLattice> *e_4;
  const_iterator __end5;
  const_iterator __begin5;
  vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
  *__range5;
  vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
  *vec;
  array<wasm::RandomElement<wasm::RandomLattice>,_2UL> *e_3;
  Element *e_2;
  Element *e_1;
  RandomElement<wasm::RandomFullLattice> *e;
  int depth_local;
  Element *elem_local;
  ostream *os_local;
  
  pEVar2 = RandomElement<wasm::RandomLattice>::operator*(elem);
  elem_00 = std::
            get_if<wasm::RandomElement<wasm::RandomFullLattice>,wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                      (&pEVar2->super_LatticeElementVariant);
  if (elem_00 == (add_pointer_t<const_wasm::RandomElement<wasm::RandomFullLattice>_>)0x0) {
    indent(os,depth);
    pEVar2 = RandomElement<wasm::RandomLattice>::operator*(elem);
    this = std::
           get_if<wasm::analysis::Flat<unsigned_int>::Element,wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                     (&pEVar2->super_LatticeElementVariant);
    if (this == (add_pointer_t<const_wasm::analysis::Flat<unsigned_int>::Element>)0x0) {
      pEVar2 = RandomElement<wasm::RandomLattice>::operator*(elem);
      this_00 = &std::
                 get_if<wasm::analysis::Lift<wasm::RandomLattice>::Element,wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                           (&pEVar2->super_LatticeElementVariant)->
                 super_optional<wasm::RandomElement<wasm::RandomLattice>_>;
      if (this_00 == (optional<wasm::RandomElement<wasm::RandomLattice>_> *)0x0) {
        pEVar2 = RandomElement<wasm::RandomLattice>::operator*(elem);
        this_01 = std::
                  get_if<std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                            (&pEVar2->super_LatticeElementVariant);
        if (this_01 ==
            (add_pointer_t<const_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>_>)0x0) {
          pEVar2 = RandomElement<wasm::RandomLattice>::operator*(elem);
          this_02 = std::
                    get_if<std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                              (&pEVar2->super_LatticeElementVariant);
          if (this_02 ==
              (add_pointer_t<const_std::vector<wasm::RandomElement<wasm::RandomLattice>_>_>)0x0) {
            pEVar2 = RandomElement<wasm::RandomLattice>::operator*(elem);
            __t = std::
                  get_if<std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                            (&pEVar2->super_LatticeElementVariant);
            if (__t == (add_pointer_t<const_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>_>
                        )0x0) {
              pEVar2 = RandomElement<wasm::RandomLattice>::operator*(elem);
              this_03 = std::
                        get_if<wasm::analysis::SharedPath<wasm::RandomLattice>::Element,wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                                  (&pEVar2->super_LatticeElementVariant);
              if (this_03 ==
                  (add_pointer_t<const_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>)0x0
                 ) {
                wasm::handle_unreachable
                          ("unexpected element",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-lattices.cpp"
                           ,499);
              }
              std::operator<<(os,"SharedPath(\n");
              elem_05 = analysis::SharedPath<wasm::RandomLattice>::Element::operator*(this_03);
              printElement(os,elem_05,depth + 1);
              indent(os,depth);
              std::operator<<(os,")\n");
            }
            else {
              std::operator<<(os,"Tuple(\n");
              elem_03 = std::
                        get<0ul,wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>
                                  (__t);
              elem_04 = std::
                        get<1ul,wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>
                                  (__t);
              printElement(os,elem_03,depth + 1);
              printElement(os,elem_04,depth + 1);
              indent(os,depth);
              std::operator<<(os,")\n");
            }
          }
          else {
            std::operator<<(os,"Vector[\n");
            __end5 = std::
                     vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
                     ::begin(this_02);
            e_4 = (RandomElement<wasm::RandomLattice> *)
                  std::
                  vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
                  ::end(this_02);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end5,(__normal_iterator<const_wasm::RandomElement<wasm::RandomLattice>_*,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>_>
                                               *)&e_4), bVar1) {
              elem_02 = __gnu_cxx::
                        __normal_iterator<const_wasm::RandomElement<wasm::RandomLattice>_*,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>_>
                        ::operator*(&__end5);
              printElement(os,elem_02,depth + 1);
              __gnu_cxx::
              __normal_iterator<const_wasm::RandomElement<wasm::RandomLattice>_*,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>_>
              ::operator++(&__end5);
            }
            indent(os,depth);
            std::operator<<(os,"]\n");
          }
        }
        else {
          std::operator<<(os,"Array[\n");
          pvVar5 = std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>::front(this_01);
          printElement(os,pvVar5,depth + 1);
          pvVar5 = std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>::back(this_01);
          printElement(os,pvVar5,depth + 1);
          indent(os,depth);
          std::operator<<(os,")\n");
        }
      }
      else {
        bVar1 = analysis::Lift<wasm::RandomLattice>::Element::isBottom((Element *)this_00);
        if (bVar1) {
          std::operator<<(os,"lift bot\n");
        }
        else {
          std::operator<<(os,"Lifted(\n");
          elem_01 = std::optional<wasm::RandomElement<wasm::RandomLattice>_>::operator*(this_00);
          printElement(os,elem_01,depth + 1);
          indent(os,depth);
          std::operator<<(os,")\n");
        }
      }
    }
    else {
      bVar1 = analysis::Flat<unsigned_int>::Element::isBottom(this);
      if (bVar1) {
        std::operator<<(os,"flat bot\n");
      }
      else {
        bVar1 = analysis::Flat<unsigned_int>::Element::isTop(this);
        if (bVar1) {
          std::operator<<(os,"flat top\n");
        }
        else {
          poVar3 = std::operator<<(os,"flat ");
          puVar4 = analysis::Flat<unsigned_int>::Element::getVal(this);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,*puVar4);
          std::operator<<(poVar3,"\n");
        }
      }
    }
  }
  else {
    printFullElement(os,elem_00,depth);
  }
  return;
}

Assistant:

void printElement(std::ostream& os,
                  const typename RandomLattice::Element& elem,
                  int depth = 0) {
  if (const auto* e =
        std::get_if<typename RandomFullLattice::Element>(&*elem)) {
    printFullElement(os, *e, depth);
    return;
  }

  indent(os, depth);

  if (const auto* e = std::get_if<typename Flat<uint32_t>::Element>(&*elem)) {
    if (e->isBottom()) {
      os << "flat bot\n";
    } else if (e->isTop()) {
      os << "flat top\n";
    } else {
      os << "flat " << *e->getVal() << "\n";
    }
  } else if (const auto* e =
               std::get_if<typename Lift<RandomLattice>::Element>(&*elem)) {
    if (e->isBottom()) {
      os << "lift bot\n";
    } else {
      os << "Lifted(\n";
      printElement(os, **e, depth + 1);
      indent(os, depth);
      os << ")\n";
    }
  } else if (const auto* e =
               std::get_if<typename ArrayLattice::Element>(&*elem)) {
    os << "Array[\n";
    printElement(os, e->front(), depth + 1);
    printElement(os, e->back(), depth + 1);
    indent(os, depth);
    os << ")\n";
  } else if (const auto* vec =
               std::get_if<typename Vector<RandomLattice>::Element>(&*elem)) {
    os << "Vector[\n";
    for (const auto& e : *vec) {
      printElement(os, e, depth + 1);
    }
    indent(os, depth);
    os << "]\n";
  } else if (const auto* e =
               std::get_if<typename TupleLattice::Element>(&*elem)) {
    os << "Tuple(\n";
    const auto& [first, second] = *e;
    printElement(os, first, depth + 1);
    printElement(os, second, depth + 1);
    indent(os, depth);
    os << ")\n";
  } else if (const auto* e =
               std::get_if<typename SharedPath<RandomLattice>::Element>(
                 &*elem)) {
    os << "SharedPath(\n";
    printElement(os, **e, depth + 1);
    indent(os, depth);
    os << ")\n";
  } else {
    WASM_UNREACHABLE("unexpected element");
  }
}